

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O0

void point_add_mixed(pt_prj_t_conflict3 *R,pt_prj_t_conflict3 *Q,pt_aff_t_conflict3 *P)

{
  long in_RDX;
  limb_t nz;
  fe_t_conflict2 Z3;
  fe_t_conflict2 Y3;
  fe_t_conflict2 X3;
  limb_t *Y2;
  limb_t *X2;
  limb_t *Z1;
  limb_t *Y1;
  limb_t *X1;
  limb_t *b;
  fe_t_conflict2 t4;
  fe_t_conflict2 t3;
  fe_t_conflict2 t2;
  fe_t_conflict2 t1;
  fe_t_conflict2 t0;
  uint64_t *in_stack_000010a0;
  uint64_t *in_stack_000010a8;
  uint64_t *in_stack_000010b0;
  uint64_t local_250 [7];
  uint64_t *in_stack_fffffffffffffde8;
  uint64_t *in_stack_fffffffffffffdf0;
  fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 in_stack_fffffffffffffdff;
  uint64_t *in_stack_fffffffffffffe00;
  uint64_t *in_stack_fffffffffffffeb0;
  uint64_t *in_stack_fffffffffffffeb8;
  uint64_t *in_stack_fffffffffffffec0;
  uint64_t *in_stack_fffffffffffffef0;
  uint64_t *in_stack_fffffffffffffef8;
  uint64_t *in_stack_ffffffffffffff00;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_nonzero(local_250,(uint64_t *)(in_RDX + 0x40));
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_000010b0,in_stack_000010a8,in_stack_000010a0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_selectznz
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  return;
}

Assistant:

static void point_add_mixed(pt_prj_t *R, const pt_prj_t *Q, const pt_aff_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3;
    /* constants */
    const limb_t *d = const_d;
    /* set pointers for Edwards curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *T1 = Q->T;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    const limb_t *T2 = P->T;
    limb_t *X3 = R->X;
    limb_t *Y3 = R->Y;
    limb_t *T3 = R->T;
    limb_t *Z3 = R->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t0, X1, X2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t1, Y1, Y2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t2, d, T2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t2, T1, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_add(X3, X1, Y1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_add(Y3, X2, Y2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(T3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(t3, T3, t0);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(T3, t3, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_add(t3, Z1, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(Z3, Z1, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_sub(t1, t1, t0);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(X3, T3, Z3);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(Y3, t3, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(T3, T3, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(Z3, Z3, t3);
}